

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

void ma_clip_samples_s24(ma_uint8 *pDst,ma_int64 *pSrc,ma_uint64 count)

{
  ma_uint64 mVar1;
  long lVar2;
  ma_uint8 *pmVar3;
  
  if (count != 0) {
    pmVar3 = pDst + 2;
    mVar1 = 0;
    do {
      lVar2 = pSrc[mVar1];
      if (0x7ffffe < lVar2) {
        lVar2 = 0x7fffff;
      }
      if (lVar2 < -0x7fffff) {
        lVar2 = -0x800000;
      }
      pmVar3[-2] = (ma_uint8)lVar2;
      pmVar3[-1] = (ma_uint8)((ulong)lVar2 >> 8);
      *pmVar3 = (ma_uint8)((ulong)lVar2 >> 0x10);
      mVar1 = mVar1 + 1;
      pmVar3 = pmVar3 + 3;
    } while (count != mVar1);
  }
  return;
}

Assistant:

MA_API void ma_clip_samples_s24(ma_uint8* pDst, const ma_int64* pSrc, ma_uint64 count)
{
    ma_uint64 iSample;

    MA_ASSERT(pDst != NULL);
    MA_ASSERT(pSrc != NULL);

    for (iSample = 0; iSample < count; iSample += 1) {
        ma_int64 s = ma_clip_s24(pSrc[iSample]);
        pDst[iSample*3 + 0] = (ma_uint8)((s & 0x000000FF) >>  0);
        pDst[iSample*3 + 1] = (ma_uint8)((s & 0x0000FF00) >>  8);
        pDst[iSample*3 + 2] = (ma_uint8)((s & 0x00FF0000) >> 16);
    }
}